

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.cc
# Opt level: O2

void lrit::to_json(json *j,AncillaryTextHeader *h)

{
  value_t vVar1;
  json_value jVar2;
  reference pvVar3;
  runtime_error *this;
  int *in_R9;
  pointer pbVar4;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  local_f8;
  json *local_e8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  elements;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  pairs;
  string key;
  string value;
  string local_70;
  string local_50;
  
  local_e8 = j;
  std::__cxx11::string::string((string *)&local_70,(string *)&h->text);
  util::split(&pairs,&local_70,';');
  std::__cxx11::string::~string((string *)&local_70);
  pbVar4 = pairs.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  while( true ) {
    if (pbVar4 == pairs.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&pairs);
      return;
    }
    std::__cxx11::string::string((string *)&local_50,(string *)pbVar4);
    util::split(&elements,&local_50,'=');
    std::__cxx11::string::~string((string *)&local_50);
    if ((long)elements.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)elements.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start != 0x40) break;
    util::trimRight(&key,elements.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start);
    util::trimLeft(&value,elements.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + 1);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::
    basic_json<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
              (&local_f8,&value);
    pvVar3 = nlohmann::
             basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
             ::operator[](local_e8,&key);
    vVar1 = pvVar3->m_type;
    pvVar3->m_type = local_f8.m_type;
    jVar2 = pvVar3->m_value;
    pvVar3->m_value = local_f8.m_value;
    local_f8.m_type = vVar1;
    local_f8.m_value = jVar2;
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::~basic_json(&local_f8);
    std::__cxx11::string::~string((string *)&value);
    std::__cxx11::string::~string((string *)&key);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&elements);
    pbVar4 = pbVar4 + 1;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  value._M_dataplus._M_p._0_4_ = 0x69;
  util::str<char[44],char[87],char[2],int>
            (&key,(util *)"Assertion `elements.size() == 2` failed at ",
             (char (*) [44])
             "/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/src/lrit/json.cc"
             ,(char (*) [87])0x1c0c61,(char (*) [2])&value,in_R9);
  std::runtime_error::runtime_error(this,(string *)&key);
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void to_json(json& j, const AncillaryTextHeader& h) {
  // The ancillary text header is an opaque string per the LRIT spec.
  // However, we know it has some structure and further decode it.
  auto pairs = split(h.text, ';');
  for (const auto& pair : pairs) {
    auto elements = split(pair, '=');
    ASSERT(elements.size() == 2);
    auto key = trimRight(elements[0]);
    auto value = trimLeft(elements[1]);
    j[key] = value;
  }
}